

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::base::Writer::triggerDispatch(Writer *this)

{
  Level level;
  char *pcVar1;
  unsigned_long line;
  bool bVar2;
  stringstream_t *psVar3;
  element_type *this_00;
  Writer *pWVar4;
  ostream *poVar5;
  string local_3c0 [32];
  stringstream local_3a0 [8];
  stringstream reasonStream;
  ostream local_390 [376];
  Writer local_218;
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178;
  allocator local_141;
  string local_140;
  LogMessage local_120;
  LogDispatcher local_a0;
  Writer *local_10;
  Writer *this_local;
  
  local_10 = this;
  if ((this->m_proceed & 1U) != 0) {
    bVar2 = this->m_proceed;
    level = this->m_level;
    pcVar1 = this->m_file;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_140,pcVar1,&local_141);
    line = this->m_line;
    pcVar1 = this->m_func;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_178,pcVar1,&local_179);
    LogMessage::LogMessage
              (&local_120,level,&local_140,line,&local_178,this->m_verboseLevel,this->m_logger);
    LogDispatcher::LogDispatcher(&local_a0,(bool)(bVar2 & 1),&local_120,this->m_dispatchAction);
    LogDispatcher::dispatch(&local_a0);
    LogDispatcher::~LogDispatcher(&local_a0);
    LogMessage::~LogMessage(&local_120);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
  }
  if (this->m_logger != (Logger *)0x0) {
    psVar3 = Logger::stream_abi_cxx11_(this->m_logger);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"",&local_1a1);
    std::__cxx11::stringstream::str((string *)psVar3);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    (*(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe[1])();
  }
  if (((this->m_proceed & 1U) != 0) && (this->m_level == Fatal)) {
    this_00 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)elStorage);
    bVar2 = Storage::hasFlag(this_00,DisableApplicationAbortOnFatalLog);
    if (!bVar2) {
      Writer(&local_218,Warning,this->m_file,this->m_line,this->m_func,NormalLog,0);
      pWVar4 = construct(&local_218,1,consts::kDefaultLoggerId);
      pWVar4 = operator<<(pWVar4,(char (*) [45])"Aborting application. Reason: Fatal log at [");
      pWVar4 = operator<<(pWVar4,&this->m_file);
      pWVar4 = operator<<(pWVar4,(char (*) [2])":");
      pWVar4 = operator<<(pWVar4,&this->m_line);
      operator<<(pWVar4,(char (*) [2])0x171a15);
      ~Writer(&local_218);
      std::__cxx11::stringstream::stringstream(local_3a0);
      poVar5 = std::operator<<(local_390,"Fatal log at [");
      poVar5 = std::operator<<(poVar5,this->m_file);
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_line);
      poVar5 = std::operator<<(poVar5,"]");
      poVar5 = std::operator<<(poVar5," If you wish to disable \'abort on fatal log\' please use ");
      std::operator<<(poVar5,
                      "el::Helpers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)");
      std::__cxx11::stringstream::str();
      utils::abort();
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::stringstream::~stringstream(local_3a0);
    }
  }
  this->m_proceed = false;
  return;
}

Assistant:

void triggerDispatch(void) {
        if (m_proceed) {
            base::LogDispatcher(m_proceed, LogMessage(m_level, m_file, m_line, m_func, m_verboseLevel,
                          m_logger), m_dispatchAction).dispatch();
        }
        if (m_logger != nullptr) {
            m_logger->stream().str(ELPP_LITERAL(""));
            m_logger->releaseLock();
        }
        if (m_proceed && m_level == Level::Fatal
                && !ELPP->hasFlag(LoggingFlag::DisableApplicationAbortOnFatalLog)) {
            base::Writer(Level::Warning, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
                    << "Aborting application. Reason: Fatal log at [" << m_file << ":" << m_line << "]";
            std::stringstream reasonStream;
            reasonStream << "Fatal log at [" << m_file << ":" << m_line << "]"
                << " If you wish to disable 'abort on fatal log' please use "
                << "el::Helpers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)";
            base::utils::abort(1, reasonStream.str());
        }
        m_proceed = false;
    }